

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,char val)

{
  value_t vVar1;
  json_value jVar2;
  string *val_00;
  reference pvVar3;
  string_view valname;
  char val_local;
  json json;
  NamedPoint namePoint;
  data local_30;
  data local_20;
  
  val_local = val;
  switch(type) {
  case HELICS_DOUBLE:
    namePoint.name._M_dataplus._M_p = (pointer)(double)(int)val;
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&namePoint);
    break;
  case HELICS_INT:
  case HELICS_TIME:
    namePoint.name._M_dataplus._M_p = (pointer)(long)val;
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&namePoint);
    break;
  case HELICS_COMPLEX:
    namePoint.name._M_dataplus._M_p = (pointer)(double)(int)val;
    namePoint.name._M_string_length = 0;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&namePoint);
    break;
  case HELICS_VECTOR:
    namePoint.name._M_dataplus._M_p = (pointer)(double)(int)val;
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&namePoint,1);
    break;
  case HELICS_COMPLEX_VECTOR:
    namePoint.name._M_dataplus._M_p = (pointer)(double)(int)val;
    namePoint.name._M_string_length = 0;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&namePoint,1);
    break;
  case HELICS_NAMED_POINT:
    valname._M_str = "value";
    valname._M_len = 5;
    NamedPoint::NamedPoint(&namePoint,valname,(double)(int)val);
    ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&namePoint);
    std::__cxx11::string::~string((string *)&namePoint);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_INT);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_20.m_type;
      jVar2 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value = local_20.m_value;
      local_20.m_type = vVar1;
      local_20.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_20);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<char_&,_char,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_30,&val_local);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_30.m_type;
      jVar2 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value = local_30.m_value;
      local_30.m_type = vVar1;
      local_30.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_30);
      fileops::generateJsonString(&namePoint.name,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>(__return_storage_ptr__,&namePoint.name);
      std::__cxx11::string::~string((string *)&namePoint);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
  case HELICS_BOOL:
    namePoint.name._M_dataplus._M_p = (pointer)0x1;
    namePoint.name._M_string_length = (size_type)&val_local;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&namePoint
              );
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, char val)
{
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(static_cast<double>(val));
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(static_cast<std::int64_t>(val));
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(
                std::complex<double>(static_cast<double>(val), 0.0));
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        case DataType::HELICS_BOOL:
        default:
            return ValueConverter<std::string_view>::convert(std::string_view(&val, 1));
        case DataType::HELICS_NAMED_POINT: {
            const NamedPoint namePoint{"value", static_cast<double>(val)};
            return ValueConverter<NamedPoint>::convert(namePoint);
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cvec(static_cast<double>(val), 0.0);
            return ValueConverter<std::complex<double>>::convert(&cvec, 1);
        }
        case DataType::HELICS_VECTOR: {
            const auto doubleVal = static_cast<double>(val);
            return ValueConverter<double>::convert(&doubleVal, 1);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_INT);
            json["value"] = val;
            return fileops::generateJsonString(json);
        }
    }
}